

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzgnames.cpp
# Opt level: O2

UVector * __thiscall
icu_63::GNameSearchHandler::getMatches(GNameSearchHandler *this,int32_t *maxMatchLen)

{
  UVector *pUVar1;
  
  pUVar1 = this->fResults;
  *maxMatchLen = this->fMaxMatchLen;
  this->fResults = (UVector *)0x0;
  this->fMaxMatchLen = 0;
  return pUVar1;
}

Assistant:

UVector*
GNameSearchHandler::getMatches(int32_t& maxMatchLen) {
    // give the ownership to the caller
    UVector *results = fResults;
    maxMatchLen = fMaxMatchLen;

    // reset
    fResults = NULL;
    fMaxMatchLen = 0;
    return results;
}